

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void maxmin(int *a,int n,int *max,int *min)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int min1;
  int min2;
  int max2;
  int max1;
  
  if (n == 2) {
    iVar2 = *a;
    iVar1 = a[1];
    iVar4 = iVar1;
    if (iVar1 < iVar2) {
      iVar4 = iVar2;
    }
    *max = iVar4;
    piVar3 = a + 1;
    if (iVar2 <= iVar1) {
      piVar3 = a;
    }
    min2 = *piVar3;
  }
  else if (n == 1) {
    min2 = *a;
    *max = min2;
  }
  else {
    iVar2 = n / 2;
    maxmin(a,iVar2,&max1,&min1);
    maxmin(a + iVar2,n - iVar2,&max2,&min2);
    if (max2 < max1) {
      max2 = max1;
    }
    *max = max2;
    if (min1 < min2) {
      min2 = min1;
    }
  }
  *min = min2;
  return;
}

Assistant:

void maxmin(int *a,int n,int *max,int *min)
{
    int max1,min1,max2,min2;
    switch(n)
    {
        case 1: *max=a[0];
            *min=a[0];
            return;
        case 2: if(a[0]>a[1])
            {
                *max=a[0];
                *min=a[1];
            }
            else
            {
                *max=a[1];
                *min=a[0];
            }
            return;
        default:maxmin(a,n/2,&max1,&min1);
            maxmin(a+n/2,n-n/2,&max2,&min2);
            *max=(max1>max2?max1:max2);
            *min=(min1<min2?min1:min2);
            return;
    }
}